

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O1

void * SPRKStepCreate(ARKRhsFn f1,ARKRhsFn f2,sunrealtype t0,N_Vector y0,SUNContext_conflict sunctx)

{
  int iVar1;
  ARKodeMem pAVar2;
  undefined8 *puVar3;
  int error_code;
  char *msgfmt;
  N_Vector *v;
  ARKodeMem ark_mem;
  ARKodeMem local_38;
  sunrealtype local_30;
  
  local_38 = (ARKodeMem)0x0;
  if (f1 == (ARKRhsFn)0x0) {
    msgfmt = "Must specify at least one of fe, fi (both NULL).";
    pAVar2 = (ARKodeMem)0x0;
    error_code = -0x16;
    iVar1 = 0x2e;
  }
  else if (f2 == (ARKRhsFn)0x0) {
    msgfmt = "Must specify at least one of fe, fi (both NULL).";
    pAVar2 = (ARKodeMem)0x0;
    error_code = -0x16;
    iVar1 = 0x35;
  }
  else if (y0 == (N_Vector)0x0) {
    msgfmt = "y0 = NULL illegal.";
    pAVar2 = (ARKodeMem)0x0;
    error_code = -0x16;
    iVar1 = 0x3d;
  }
  else if (sunctx == (SUNContext_conflict)0x0) {
    msgfmt = "sunctx = NULL illegal.";
    pAVar2 = (ARKodeMem)0x0;
    error_code = -0x16;
    iVar1 = 0x44;
  }
  else {
    local_30 = t0;
    pAVar2 = arkCreate(sunctx);
    local_38 = pAVar2;
    if (pAVar2 == (ARKodeMem)0x0) {
      msgfmt = "arkode_mem = NULL illegal.";
      pAVar2 = (ARKodeMem)0x0;
      error_code = -0x15;
      iVar1 = 0x4d;
    }
    else {
      puVar3 = (undefined8 *)malloc(0x48);
      if (puVar3 != (undefined8 *)0x0) {
        puVar3[6] = 0;
        puVar3[7] = 0;
        puVar3[4] = 0;
        puVar3[5] = 0;
        puVar3[2] = 0;
        puVar3[3] = 0;
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3[8] = 0;
        iVar1 = arkAllocVec(pAVar2,y0,(N_Vector *)(puVar3 + 2));
        if (iVar1 != 0) {
          v = (N_Vector *)(puVar3 + 3);
          if (local_38->use_compensated_sums == 0) {
            *v = (N_Vector)0x0;
          }
          else {
            iVar1 = arkAllocVec(local_38,y0,v);
            if (iVar1 == 0) goto LAB_00161066;
            N_VConst(0,*v);
          }
          local_38->step_init = sprkStep_Init;
          local_38->step_fullrhs = sprkStep_FullRHS;
          local_38->step = sprkStep_TakeStep;
          local_38->step_printallstats = sprkStep_PrintAllStats;
          local_38->step_writeparameters = sprkStep_WriteParameters;
          local_38->step_resize = sprkStep_Resize;
          local_38->step_free = sprkStep_Free;
          local_38->step_setdefaults = sprkStep_SetDefaults;
          local_38->step_setorder = sprkStep_SetOrder;
          local_38->step_getnumrhsevals = sprkStep_GetNumRhsEvals;
          local_38->step_mem = puVar3;
          iVar1 = sprkStep_SetDefaults(local_38);
          if (iVar1 != 0) {
            arkProcessError(local_38,iVar1,0x7f,"SPRKStepCreate",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                            ,"Error setting default solver options");
            ARKodeFree(&local_38);
            return (void *)0x0;
          }
          puVar3[4] = f1;
          puVar3[5] = f2;
          puVar3[6] = 0;
          puVar3[7] = 0;
          *(undefined4 *)(puVar3 + 8) = 0;
          ARKodeSetInterpolantType(local_38,1);
          iVar1 = arkInit(local_38,local_30,y0,0);
          if (iVar1 == 0) {
            return local_38;
          }
          arkProcessError(local_38,iVar1,0x96,"SPRKStepCreate",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                          ,"Unable to initialize main ARKODE infrastructure");
        }
LAB_00161066:
        ARKodeFree(&local_38);
        return (void *)0x0;
      }
      msgfmt = "Allocation of arkode_mem failed.";
      error_code = -0x14;
      iVar1 = 0x57;
    }
  }
  arkProcessError(pAVar2,error_code,iVar1,"SPRKStepCreate",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                  ,msgfmt);
  return (void *)0x0;
}

Assistant:

void* SPRKStepCreate(ARKRhsFn f1, ARKRhsFn f2, sunrealtype t0, N_Vector y0,
                     SUNContext sunctx)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* Check that f1 and f2 are supplied */
  if (!f1)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  if (!f2)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  /* Check for legal input parameters */
  if (!y0)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (NULL);
  }

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (NULL);
  }

  /* Allocate ARKodeSPRKStepMem structure, and initialize to zero */
  step_mem = NULL;
  step_mem = (ARKodeSPRKStepMem)malloc(sizeof(struct ARKodeSPRKStepMemRec));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return (NULL);
  }
  memset(step_mem, 0, sizeof(struct ARKodeSPRKStepMemRec));

  /* Allocate vectors in stepper mem */
  if (!arkAllocVec(ark_mem, y0, &(step_mem->sdata)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  if (ark_mem->use_compensated_sums)
  {
    if (!arkAllocVec(ark_mem, y0, &(step_mem->yerr)))
    {
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    /* Zero yerr for compensated summation */
    N_VConst(ZERO, step_mem->yerr);
  }
  else { step_mem->yerr = NULL; }
  ark_mem->step_init            = sprkStep_Init;
  ark_mem->step_fullrhs         = sprkStep_FullRHS;
  ark_mem->step                 = sprkStep_TakeStep;
  ark_mem->step_printallstats   = sprkStep_PrintAllStats;
  ark_mem->step_writeparameters = sprkStep_WriteParameters;
  ark_mem->step_resize          = sprkStep_Resize;
  ark_mem->step_free            = sprkStep_Free;
  ark_mem->step_setdefaults     = sprkStep_SetDefaults;
  ark_mem->step_setorder        = sprkStep_SetOrder;
  ark_mem->step_getnumrhsevals  = sprkStep_GetNumRhsEvals;
  ark_mem->step_mem             = (void*)step_mem;

  /* Set default values for optional inputs */
  retval = sprkStep_SetDefaults((void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->f1 = f1;
  step_mem->f2 = f2;

  /* Initialize the counters */
  step_mem->nf1    = 0;
  step_mem->nf2    = 0;
  step_mem->istage = 0;

  /* SPRKStep uses Lagrange interpolation by default, since Hermite is
     less compatible with these methods. */
  ARKodeSetInterpolantType(ark_mem, ARK_INTERP_LAGRANGE);

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  return ((void*)ark_mem);
}